

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorGradient.cpp
# Opt level: O2

DecoratorDataHandle __thiscall
Rml::DecoratorRadialGradient::GenerateElementData
          (DecoratorRadialGradient *this,Element *element,BoxArea paint_area)

{
  code *pcVar1;
  bool bVar2;
  RenderManager *mesh_00;
  ComputedValues *pCVar3;
  pointer pVVar4;
  Pool<Rml::ShaderElementData> *this_00;
  ShaderElementData *pSVar5;
  long lVar6;
  float gradient_line_length;
  Vector2f VVar7;
  float fVar8;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>
  init;
  allocator_type local_29b;
  key_compare local_29a;
  allocator<char> local_299;
  CompiledShader shader;
  undefined1 local_288 [40];
  RadialGradientShape gradient_shape;
  ColorStopList resolved_stops;
  Dictionary local_220;
  Variant local_200;
  Variant local_1d8;
  Variant local_1b0;
  RenderBox render_box;
  Mesh mesh;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
  local_110;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
  local_c8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
  local_80;
  
  mesh_00 = Element::GetRenderManager(element);
  if (mesh_00 == (RenderManager *)0x0) {
    pSVar5 = (ShaderElementData *)0x0;
  }
  else {
    if (((this->color_stops).super__Vector_base<Rml::ColorStop,_std::allocator<Rml::ColorStop>_>.
         _M_impl.super__Vector_impl_data._M_start ==
         (this->color_stops).super__Vector_base<Rml::ColorStop,_std::allocator<Rml::ColorStop>_>.
         _M_impl.super__Vector_impl_data._M_finish) || (Ellipse < this->shape)) {
      bVar2 = Assert("RMLUI_ASSERT(!color_stops.empty() && (shape == Shape::Circle || shape == Shape::Ellipse))"
                     ,
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DecoratorGradient.cpp"
                     ,0x1b6);
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
    }
    Element::GetRenderBox(&render_box,element,paint_area,0);
    gradient_shape = CalculateRadialGradientShape(this,element,render_box.fill_size);
    gradient_line_length = gradient_shape.radius.x;
    fVar8 = gradient_line_length;
    if (gradient_shape.radius.y <= gradient_line_length) {
      fVar8 = gradient_shape.radius.y;
    }
    ResolveColorStops(&resolved_stops,element,gradient_line_length,1.0 / fVar8,&this->color_stops);
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220,"radial-gradient",&local_299);
    Variant::Variant<Rml::Vector2<float>&,void>((Variant *)local_288,&gradient_shape.center);
    ::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
    ::pair<const_char_(&)[7],_Rml::Variant,_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
                *)&mesh,(char (*) [7])"center",(Variant *)local_288);
    Variant::Variant<Rml::Vector2<float>&,void>(&local_1b0,&gradient_shape.radius);
    ::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
    ::pair<const_char_(&)[7],_Rml::Variant,_true>(&local_110,(char (*) [7])0x3261f0,&local_1b0);
    Variant::Variant<bool_const&,void>(&local_1d8,&this->repeating);
    ::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
    ::pair<const_char_(&)[10],_Rml::Variant,_true>(&local_c8,(char (*) [10])"repeating",&local_1d8);
    Variant::Variant<std::vector<Rml::ColorStop,std::allocator<Rml::ColorStop>>,void>
              (&local_200,&resolved_stops);
    ::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
    ::pair<const_char_(&)[16],_Rml::Variant,_true>
              (&local_80,(char (*) [16])"color_stop_list",&local_200);
    init._M_len = 4;
    init._M_array = (iterator)&mesh;
    itlib::
    flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
    ::flat_map((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
                *)&stack0xfffffffffffffdb0,init,&local_29a,&local_29b);
    RenderManager::CompileShader((RenderManager *)&shader,(String *)mesh_00,&local_220);
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
               *)&stack0xfffffffffffffdb0);
    lVar6 = 0xd8;
    do {
      ::std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
               *)((long)&mesh.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar6));
      lVar6 = lVar6 + -0x48;
    } while (lVar6 != -0x48);
    Variant::~Variant(&local_200);
    Variant::~Variant(&local_1d8);
    Variant::~Variant(&local_1b0);
    Variant::~Variant((Variant *)local_288);
    ::std::__cxx11::string::~string((string *)&local_220);
    if (shader.super_UniqueRenderResource<Rml::CompiledShader,_unsigned_long,_0UL>.resource_handle
        == 0) {
      pSVar5 = (ShaderElementData *)0x0;
    }
    else {
      mesh.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      mesh.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      mesh.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      mesh.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      mesh.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      mesh.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      pCVar3 = Element::GetComputedValues(element);
      MeshUtilities::GenerateBackground
                (&mesh,&render_box,
                 (ColourbPremultiplied)
                 (((int)((pCVar3->inherited).opacity * 255.0) & 0xffU) * 0x1010101));
      for (pVVar4 = mesh.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pVVar4 != mesh.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>.
                    _M_impl.super__Vector_impl_data._M_finish; pVVar4 = pVVar4 + 1) {
        VVar7.x = (pVVar4->position).x - render_box.border_widths._M_elems[3];
        VVar7.y = (pVVar4->position).y - render_box.border_widths._M_elems[0];
        pVVar4->tex_coord = VVar7;
      }
      this_00 = GetShaderElementDataPool();
      RenderManager::MakeGeometry((RenderManager *)local_288,(Mesh *)mesh_00);
      pSVar5 = Pool<Rml::ShaderElementData>::AllocateAndConstruct<Rml::Geometry,Rml::CompiledShader>
                         (this_00,(Geometry *)local_288,&shader);
      UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
      ::~UniqueRenderResource
                ((UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                  *)local_288);
      Mesh::~Mesh(&mesh);
    }
    UniqueRenderResource<Rml::CompiledShader,_unsigned_long,_0UL>::~UniqueRenderResource
              (&shader.super_UniqueRenderResource<Rml::CompiledShader,_unsigned_long,_0UL>);
    ::std::_Vector_base<Rml::ColorStop,_std::allocator<Rml::ColorStop>_>::~_Vector_base
              (&resolved_stops.super__Vector_base<Rml::ColorStop,_std::allocator<Rml::ColorStop>_>);
  }
  return (DecoratorDataHandle)pSVar5;
}

Assistant:

DecoratorDataHandle DecoratorRadialGradient::GenerateElementData(Element* element, BoxArea paint_area) const
{
	RenderManager* render_manager = element->GetRenderManager();
	if (!render_manager)
		return INVALID_DECORATORDATAHANDLE;

	RMLUI_ASSERT(!color_stops.empty() && (shape == Shape::Circle || shape == Shape::Ellipse));

	const RenderBox render_box = element->GetRenderBox(paint_area);
	const Vector2f dimensions = render_box.GetFillSize();

	RadialGradientShape gradient_shape = CalculateRadialGradientShape(element, dimensions);

	// One-pixel minimum color stop spacing to avoid aliasing.
	const float soft_spacing = 1.f / Math::Min(gradient_shape.radius.x, gradient_shape.radius.y);

	ColorStopList resolved_stops = ResolveColorStops(element, gradient_shape.radius.x, soft_spacing, color_stops);

	CompiledShader shader = render_manager->CompileShader("radial-gradient",
		Dictionary{
			{"center", Variant(gradient_shape.center)},
			{"radius", Variant(gradient_shape.radius)},
			{"repeating", Variant(repeating)},
			{"color_stop_list", Variant(std::move(resolved_stops))},
		});
	if (!shader)
		return INVALID_DECORATORDATAHANDLE;

	Mesh mesh;
	const ComputedValues& computed = element->GetComputedValues();
	const byte alpha = byte(computed.opacity() * 255.f);
	MeshUtilities::GenerateBackground(mesh, render_box, ColourbPremultiplied(alpha, alpha));

	const Vector2f render_offset = render_box.GetFillOffset();
	for (Vertex& vertex : mesh.vertices)
		vertex.tex_coord = vertex.position - render_offset;

	ShaderElementData* element_data =
		GetShaderElementDataPool().AllocateAndConstruct(render_manager->MakeGeometry(std::move(mesh)), std::move(shader));
	return reinterpret_cast<DecoratorDataHandle>(element_data);
}